

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImpl::processJoystickEvents(WindowImpl *this)

{
  JoystickManager *pJVar1;
  JoystickState *__src;
  JoystickCaps *pJVar2;
  undefined1 local_c0 [8];
  Event event_2;
  undefined1 auStack_a4 [2];
  bool currPressed;
  bool prevPressed;
  uint j_1;
  Event event_1;
  float currPos;
  float prevPos;
  Axis axis;
  uint j;
  undefined1 local_78 [4];
  Event event;
  bool connected;
  JoystickCaps caps;
  JoystickState previousState;
  uint i;
  WindowImpl *this_local;
  
  unique0x10000455 = this;
  pJVar1 = JoystickManager::getInstance();
  JoystickManager::update(pJVar1);
  previousState.buttons[0x18] = false;
  previousState.buttons[0x19] = false;
  previousState.buttons[0x1a] = false;
  previousState.buttons[0x1b] = false;
  for (; (uint)previousState.buttons._24_4_ < 8;
      previousState.buttons._24_4_ = previousState.buttons._24_4_ + 1) {
    memcpy(caps.axes,this->m_joystickStates + (uint)previousState.buttons._24_4_,0x44);
    pJVar1 = JoystickManager::getInstance();
    __src = JoystickManager::getState(pJVar1,previousState.buttons._24_4_);
    memcpy(this->m_joystickStates + (uint)previousState.buttons._24_4_,__src,0x44);
    pJVar1 = JoystickManager::getInstance();
    pJVar2 = JoystickManager::getCapabilities(pJVar1,previousState.buttons._24_4_);
    event.field_1.mouseWheelScroll.y = pJVar2->buttonCount;
    unique0x00012004 = pJVar2->axes[0];
    unique0x00012005 = pJVar2->axes[1];
    unique0x00012006 = pJVar2->axes[2];
    unique0x00012007 = pJVar2->axes[3];
    caps.buttonCount = *(uint *)(pJVar2->axes + 4);
    event.field_1.mouseButton.y._3_1_ =
         this->m_joystickStates[(uint)previousState.buttons._24_4_].connected & 1;
    if ((caps.axes[0] & 1U) != event.field_1.mouseButton.y._3_1_) {
      j = 0x12;
      if (event.field_1.mouseButton.y._3_1_ != 0) {
        j = 0x11;
      }
      local_78[0] = previousState.buttons[0x18];
      local_78[1] = previousState.buttons[0x19];
      local_78[2] = previousState.buttons[0x1a];
      local_78[3] = previousState.buttons[0x1b];
      pushEvent(this,(Event *)&j);
      if ((event.field_1.mouseButton.y._3_1_ & 1) != 0) {
        axis = X;
        std::fill_n<float*,unsigned_long,float>
                  (this->m_previousAxes[(uint)previousState.buttons._24_4_],8,(float *)&axis);
      }
    }
    if ((event.field_1.mouseButton.y._3_1_ & 1) != 0) {
      for (prevPos = 0.0; (uint)prevPos < 8; prevPos = (float)((int)prevPos + 1)) {
        if (((&stack0xffffffffffffffa0)[(uint)prevPos] & 1) != 0) {
          event_1.field_1.mouseWheelScroll.y =
               (int)this->m_previousAxes[(uint)previousState.buttons._24_4_][(uint)prevPos];
          event_1.field_1.mouseButton.y =
               (int)this->m_joystickStates[(uint)previousState.buttons._24_4_].axes[(uint)prevPos];
          if ((double)this->m_joystickThreshold <=
              (double)((ulong)(double)(event_1.field_1.joystickMove.position -
                                      event_1.field_1.sensor.z) & (ulong)DAT_0029c2e0)) {
            _auStack_a4 = JoystickMoved;
            j_1._0_1_ = previousState.buttons[0x18];
            j_1._1_1_ = previousState.buttons[0x19];
            j_1._2_1_ = previousState.buttons[0x1a];
            j_1._3_1_ = previousState.buttons[0x1b];
            event_1.type = (EventType)prevPos;
            event_1.field_1._0_4_ = event_1.field_1.mouseButton.y;
            pushEvent(this,(Event *)auStack_a4);
            this->m_previousAxes[(uint)previousState.buttons._24_4_][(uint)prevPos] =
                 (float)event_1.field_1.mouseButton.y;
          }
        }
      }
      for (event_2.field_1.mouseWheelScroll.y = 0;
          (uint)event_2.field_1.mouseWheelScroll.y < (uint)event.field_1.mouseWheelScroll.y;
          event_2.field_1.mouseWheelScroll.y = event_2.field_1.mouseWheelScroll.y + 1) {
        event_2.field_1.mouseButton.y._3_1_ =
             *(byte *)((long)previousState.axes +
                      (ulong)(uint)event_2.field_1.mouseWheelScroll.y + 0x18) & 1;
        event_2.field_1.mouseButton.y._2_1_ =
             this->m_joystickStates[(uint)previousState.buttons._24_4_].buttons
             [(uint)event_2.field_1.mouseWheelScroll.y] & 1;
        if (event_2.field_1.mouseButton.y._3_1_ != event_2.field_1.mouseButton.y._2_1_) {
          local_c0._0_4_ = JoystickButtonReleased;
          if (event_2.field_1.mouseButton.y._2_1_ != 0) {
            local_c0._0_4_ = JoystickButtonPressed;
          }
          local_c0[4] = previousState.buttons[0x18];
          local_c0[5] = previousState.buttons[0x19];
          local_c0[6] = previousState.buttons[0x1a];
          local_c0[7] = previousState.buttons[0x1b];
          event_2.type = event_2.field_1.mouseWheelScroll.y;
          pushEvent(this,(Event *)local_c0);
        }
      }
    }
  }
  return;
}

Assistant:

void WindowImpl::processJoystickEvents()
{
    // First update the global joystick states
    JoystickManager::getInstance().update();

    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        // Copy the previous state of the joystick and get the new one
        JoystickState previousState = m_joystickStates[i];
        m_joystickStates[i] = JoystickManager::getInstance().getState(i);
        JoystickCaps caps = JoystickManager::getInstance().getCapabilities(i);

        // Connection state
        bool connected = m_joystickStates[i].connected;
        if (previousState.connected ^ connected)
        {
            Event event;
            event.type = connected ? Event::JoystickConnected : Event::JoystickDisconnected;
            event.joystickButton.joystickId = i;
            pushEvent(event);

            // Clear previous axes positions
            if (connected)
                std::fill_n(m_previousAxes[i], static_cast<std::size_t>(Joystick::AxisCount), 0.f);
        }

        if (connected)
        {
            // Axes
            for (unsigned int j = 0; j < Joystick::AxisCount; ++j)
            {
                if (caps.axes[j])
                {
                    Joystick::Axis axis = static_cast<Joystick::Axis>(j);
                    float prevPos = m_previousAxes[i][axis];
                    float currPos = m_joystickStates[i].axes[axis];
                    if (fabs(currPos - prevPos) >= m_joystickThreshold)
                    {
                        Event event;
                        event.type = Event::JoystickMoved;
                        event.joystickMove.joystickId = i;
                        event.joystickMove.axis = axis;
                        event.joystickMove.position = currPos;
                        pushEvent(event);

                        m_previousAxes[i][axis] = currPos;
                    }
                }
            }

            // Buttons
            for (unsigned int j = 0; j < caps.buttonCount; ++j)
            {
                bool prevPressed = previousState.buttons[j];
                bool currPressed = m_joystickStates[i].buttons[j];

                if (prevPressed ^ currPressed)
                {
                    Event event;
                    event.type = currPressed ? Event::JoystickButtonPressed : Event::JoystickButtonReleased;
                    event.joystickButton.joystickId = i;
                    event.joystickButton.button = j;
                    pushEvent(event);
                }
            }
        }
    }
}